

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.c
# Opt level: O3

void av1_calculate_segdata(segmentation *seg)

{
  byte bVar1;
  int i;
  long lVar2;
  int j;
  uint uVar3;
  
  seg->segid_preskip = '\0';
  seg->last_active_segid = 0;
  bVar1 = 0;
  lVar2 = 0;
  do {
    uVar3 = 0;
    do {
      if ((seg->feature_mask[lVar2] >> (uVar3 & 0x1f) & 1) != 0) {
        bVar1 = bVar1 | 4 < uVar3;
        seg->segid_preskip = bVar1;
        seg->last_active_segid = (int)lVar2;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void av1_calculate_segdata(struct segmentation *seg) {
  seg->segid_preskip = 0;
  seg->last_active_segid = 0;
  for (int i = 0; i < MAX_SEGMENTS; i++) {
    for (int j = 0; j < SEG_LVL_MAX; j++) {
      if (seg->feature_mask[i] & (1 << j)) {
        seg->segid_preskip |= (j >= SEG_LVL_REF_FRAME);
        seg->last_active_segid = i;
      }
    }
  }
}